

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BlendState::BlendState
          (BlendState *this,Maybe<bool> *enableBlend_,
          Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
          *blendEq_,
          Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
          *blendFunc_,Maybe<tcu::Vector<bool,_4>_> *colorMask_)

{
  (this->enableBlend).m_ptr = (bool *)0x0;
  if (enableBlend_->m_ptr != (bool *)0x0) {
    (this->enableBlend).field_1.m_data[0] = *enableBlend_->m_ptr;
    (this->enableBlend).m_ptr = (bool *)&(this->enableBlend).field_1;
  }
  tcu::
  Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
  ::Maybe(&this->blendEq,blendEq_);
  tcu::
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  ::Maybe(&this->blendFunc,blendFunc_);
  tcu::Maybe<tcu::Vector<bool,_4>_>::Maybe(&this->colorMask,colorMask_);
  return;
}

Assistant:

BlendState (const Maybe<bool>&									enableBlend_,
				const Maybe<Either<BlendEq, SeparateBlendEq> >&		blendEq_,
				const Maybe<Either<BlendFunc, SeparateBlendFunc> >&	blendFunc_,
				const Maybe<BVec4>&									colorMask_)
		: enableBlend	(enableBlend_)
		, blendEq		(blendEq_)
		, blendFunc		(blendFunc_)
		, colorMask		(colorMask_)
	{
	}